

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# revp.c
# Opt level: O1

void REVset_attr_list_handler
               (CManager_conflict cm,CMConnection conn,void *data,void *client_data,
               attr_list message_attrs)

{
  CMFormat format;
  attr_list list;
  EV_void_response response;
  undefined4 local_2c;
  
  format = CMlookup_format(conn->cm,EV_void_response_formats);
  if (format == (CMFormat)0x0) {
    format = INT_CMregister_format(conn->cm,EV_void_response_formats);
  }
  list = (attr_list)attr_list_from_string(*(undefined8 *)((long)data + 8));
  EVset_attr_list(cm,*(EVstone *)((long)data + 4),list);
  free_attr_list(list);
  local_2c = *data;
  CMwrite(conn,format,&local_2c);
  return;
}

Assistant:

static void
REVset_attr_list_handler(CManager cm, CMConnection conn, void *data,void *client_data,attr_list message_attrs)
{
    EV_void_response response;
    EVset_attr_list_request *request = (EVset_attr_list_request *) data;
    CMFormat f = CMlookup_format(conn->cm, EV_void_response_formats);
    (void) message_attrs;
    (void) client_data;
    if (f == NULL) {
        f = INT_CMregister_format(conn->cm, EV_void_response_formats);
    }
    attr_list list = attr_list_from_string(request->list);
    EVset_attr_list(cm, request->stone_id, list);
free_attr_list(list);
    response.condition_var = request->condition_var;
    CMwrite(conn, f, &response);
}